

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

Matrix * __thiscall Matrix::operator=(Matrix *this,Matrix *other)

{
  int iVar1;
  double *__dest;
  int iVar2;
  ulong uVar3;
  
  if (this != other) {
    iVar1 = other->rows;
    this->rows = iVar1;
    iVar2 = other->cols;
    this->cols = iVar2;
    iVar2 = iVar2 * iVar1;
    uVar3 = 0xffffffffffffffff;
    if (-1 < iVar2) {
      uVar3 = (long)iVar2 * 8;
    }
    __dest = (double *)operator_new__(uVar3);
    this->data = __dest;
    if (iVar2 != 0) {
      memmove(__dest,other->data,(long)iVar2 * 8);
    }
  }
  return this;
}

Assistant:

Matrix& Matrix::operator=(const Matrix& other)
{
    if (this == &other)
        return *this;

    rows = other.rows;
    cols = other.cols;

    data = new double[rows * cols];
    std::copy(other.data, other.data + rows * cols, data);

    return *this;
}